

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O0

void push_to_stack(em8051 *aCPU,int aValue)

{
  int aValue_local;
  em8051 *aCPU_local;
  
  aCPU->mSFR[1] = aCPU->mSFR[1] + '\x01';
  if (aCPU->mSFR[1] < 0x80) {
    aCPU->mLowerData[aCPU->mSFR[1]] = (uchar)aValue;
  }
  else if (aCPU->mUpperData == (uchar *)0x0) {
    if (aCPU->except != (em8051exception)0x0) {
      (*aCPU->except)(aCPU,0);
    }
  }
  else {
    aCPU->mUpperData[(int)(aCPU->mSFR[1] - 0x80)] = (uchar)aValue;
  }
  if ((aCPU->mSFR[1] == '\0') && (aCPU->except != (em8051exception)0x0)) {
    (*aCPU->except)(aCPU,0);
  }
  return;
}

Assistant:

void push_to_stack(struct em8051 *aCPU, int aValue)
{
    aCPU->mSFR[REG_SP]++;
    if (aCPU->mSFR[REG_SP] > 0x7f)
    {
        if (aCPU->mUpperData)
        {
            aCPU->mUpperData[aCPU->mSFR[REG_SP] - 0x80] = aValue;
        }
        else
        {
            if (aCPU->except)
                aCPU->except(aCPU, EXCEPTION_STACK);
        }
    }
    else
    {
        aCPU->mLowerData[aCPU->mSFR[REG_SP]] = aValue;
    }
    if (aCPU->mSFR[REG_SP] == 0)
        if (aCPU->except)
            aCPU->except(aCPU, EXCEPTION_STACK);
}